

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iaf_psc_alpha.cpp
# Opt level: O1

void __thiscall iaf_psc_alpha::iaf_psc_alpha(iaf_psc_alpha *this,long n_populationID,int n_neuronID)

{
  iaf_psc_alpha_param *piVar1;
  Logging *pLVar2;
  
  (this->super_Neuron)._vptr_Neuron = (_func_int **)&PTR_update_00111cc0;
  this->shouldCalibrate = true;
  piVar1 = (iaf_psc_alpha_param *)operator_new(0x50);
  piVar1->Tau_ = 10.0;
  piVar1->C_ = 250.0;
  piVar1->TauR_ = 2.0;
  piVar1->E_L_ = -70.0;
  piVar1->I_e_ = 0.0;
  piVar1->V_reset_ = 0.0;
  piVar1->Theta_ = 15.0;
  piVar1->LowerBound_ = -1.79769313486232e+308;
  piVar1->tau_ex_ = 2.0;
  piVar1->tau_in_ = 2.0;
  this->param = piVar1;
  this->I_in_ = 0.0;
  this->y3_ = 0.0;
  this->I_ex_ = 0.0;
  this->dI_in_ = 0.0;
  this->y0_ = 0.0;
  this->dI_ex_ = 0.0;
  this->r_ = 0;
  this->ex_spikes_ = 0.0;
  this->in_spikes_ = 0.0;
  (this->super_Neuron).populationID = n_populationID;
  (this->super_Neuron).neuronID = n_neuronID;
  pLVar2 = Logging::getInstance();
  (this->super_Neuron).logger = pLVar2;
  return;
}

Assistant:

iaf_psc_alpha::iaf_psc_alpha(long n_populationID, int n_neuronID) : param(new iaf_psc_alpha_param) {
    populationID = n_populationID;
    neuronID = n_neuronID;
    initialize();
}